

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteCue(FILE *f,BlockGroup *block_group)

{
  bool bVar1;
  int iVar2;
  undefined1 local_40 [8];
  FrameParser parser;
  BlockGroup *block_group_local;
  FILE *f_local;
  
  parser.pos_end_ = (mkvpos_t)block_group;
  FrameParser::FrameParser((FrameParser *)local_40,block_group);
  iVar2 = fputc(10,(FILE *)f);
  if (iVar2 < 0) {
    f_local._7_1_ = false;
  }
  else {
    bVar1 = WriteCueIdentifier(f,(FrameParser *)local_40);
    if (bVar1) {
      bVar1 = WriteCueTimings(f,(FrameParser *)local_40);
      if (bVar1) {
        bVar1 = WriteCuePayload(f,(FrameParser *)local_40);
        if (bVar1) {
          f_local._7_1_ = true;
        }
        else {
          f_local._7_1_ = false;
        }
      }
      else {
        f_local._7_1_ = false;
      }
    }
    else {
      f_local._7_1_ = false;
    }
  }
  FrameParser::~FrameParser((FrameParser *)local_40);
  return f_local._7_1_;
}

Assistant:

bool vttdemux::WriteCue(FILE* f, const mkvparser::BlockGroup* block_group) {
  // Bind a FrameParser object to the block, which allows us to
  // extract each line of text from the payload of the block.
  FrameParser parser(block_group);

  // We start a new cue by writing a cue separator (an empty line)
  // into the stream.

  if (fputc('\n', f) < 0)
    return false;

  // A WebVTT Cue comprises 3 things: a cue identifier, followed by
  // the cue timings, followed by the payload of the cue.  We write
  // each part of the cue in sequence.

  if (!WriteCueIdentifier(f, &parser))
    return false;

  if (!WriteCueTimings(f, &parser))
    return false;

  if (!WriteCuePayload(f, &parser))
    return false;

  return true;
}